

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

SpecialName * __thiscall
(anonymous_namespace)::Db::
make<(anonymous_namespace)::SpecialName,char_const(&)[34],(anonymous_namespace)::Node*&>
          (Db *this,char (*args) [34],Node **args_1)

{
  SpecialName *this_00;
  StringView local_30;
  Node **local_20;
  Node **args_local_1;
  char (*args_local) [34];
  Db *this_local;
  
  local_20 = args_1;
  args_local_1 = (Node **)args;
  args_local = (char (*) [34])this;
  this_00 = (SpecialName *)
            anon_unknown.dwarf_2f151d::BumpPointerAllocator::allocate
                      ((BumpPointerAllocator *)(this + 0x2f0),0x28);
  StringView::StringView(&local_30,(char *)args_local_1);
  anon_unknown.dwarf_2f151d::SpecialName::SpecialName(this_00,local_30,*local_20);
  return this_00;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }